

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

void calc_sad_update_bestmv_with_indices
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int num_candidates,
               int *chkpts_indices,int *cost_list)

{
  buf_2d *pbVar1;
  buf_2d *pbVar2;
  search_site_config *psVar3;
  uint uVar4;
  FULLPEL_MV FVar5;
  short sVar6;
  ushort uVar7;
  long lVar8;
  int i;
  long lVar9;
  long lVar10;
  short sVar11;
  ushort uVar12;
  uint uVar13;
  ushort uVar14;
  short sVar15;
  short sVar16;
  undefined4 in_stack_00000024;
  
  lVar8 = CONCAT44(in_stack_00000024,num_candidates);
  pbVar1 = (ms_params->ms_buffers).ref;
  pbVar2 = (ms_params->ms_buffers).src;
  psVar3 = ms_params->search_sites;
  lVar9 = 0;
  do {
    lVar10 = (long)*(int *)(lVar8 + lVar9 * 4);
    sVar15 = psVar3->site[(uint)search_step][lVar10].mv.col + center_mv.col;
    if (((int)sVar15 < (ms_params->mv_limits).col_min) ||
       ((ms_params->mv_limits).col_max < (int)sVar15)) {
LAB_001dd7a3:
      if (chkpts_indices != (int *)0x0) {
        chkpts_indices[lVar10 + 1] = 0x7fffffff;
      }
    }
    else {
      sVar16 = psVar3->site[(uint)search_step][lVar10].mv.row + center_mv.row;
      if (((int)sVar16 < (ms_params->mv_limits).row_min) ||
         ((ms_params->mv_limits).row_max < (int)sVar16)) goto LAB_001dd7a3;
      uVar4 = (*ms_params->sdf)(pbVar2->buf,pbVar2->stride,
                                center_address + psVar3->site[(uint)search_step][lVar10].offset,
                                pbVar1->stride);
      if (chkpts_indices != (int *)0x0) {
        chkpts_indices[lVar10 + 1] = uVar4;
      }
      lVar8 = CONCAT44(in_stack_00000024,num_candidates);
      if (uVar4 < *bestsad) {
        if (mv_cost_params->mv_cost_type < 4) {
          sVar11 = sVar16 - (mv_cost_params->full_ref_mv).row;
          uVar12 = sVar11 * 8;
          sVar6 = sVar15 - (mv_cost_params->full_ref_mv).col;
          uVar7 = sVar6 * 8;
          switch(mv_cost_params->mv_cost_type) {
          case '\0':
            uVar13 = (mv_cost_params->mvcost[0][(short)uVar12] +
                      *(int *)((long)mv_cost_params->mvjcost +
                              (ulong)((uint)(uVar7 != 0) * 4 + (uint)(uVar12 != 0) * 8)) +
                     mv_cost_params->mvcost[1][(short)uVar7]) * mv_cost_params->sad_per_bit + 0x100U
                     >> 9;
            break;
          case '\x01':
            uVar14 = sVar11 * -8;
            if ((short)(sVar11 * -8) < 0) {
              uVar14 = uVar12;
            }
            uVar12 = sVar6 * -8;
            if ((short)(sVar6 * -8) < 0) {
              uVar12 = uVar7;
            }
            uVar13 = ((uint)uVar12 + (uint)uVar14) * 4;
            break;
          case '\x02':
            uVar14 = sVar11 * -8;
            if ((short)(sVar11 * -8) < 0) {
              uVar14 = uVar12;
            }
            uVar12 = sVar6 * -8;
            if ((short)(sVar6 * -8) < 0) {
              uVar12 = uVar7;
            }
            uVar13 = ((uint)uVar12 + (uint)uVar14) * 0xf >> 3;
            break;
          case '\x03':
            uVar14 = sVar11 * -8;
            if ((short)(sVar11 * -8) < 0) {
              uVar14 = uVar12;
            }
            uVar12 = sVar6 * -8;
            if ((short)(sVar6 * -8) < 0) {
              uVar12 = uVar7;
            }
            uVar13 = (uint)uVar12 + (uint)uVar14;
          }
        }
        else {
          uVar13 = 0;
        }
        lVar8 = CONCAT44(in_stack_00000024,num_candidates);
        if (uVar13 + uVar4 < *bestsad) {
          if (raw_bestsad != (uint *)0x0) {
            *raw_bestsad = uVar4;
          }
          FVar5.col = sVar15;
          FVar5.row = sVar16;
          *bestsad = uVar13 + uVar4;
          *best_mv = FVar5;
          *best_site = (int)lVar9;
        }
      }
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == 3) {
      return;
    }
  } while( true );
}

Assistant:

static inline void calc_sad_update_bestmv_with_indices(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, const int num_candidates, const int *chkpts_indices,
    int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  // Loop over number of candidates.
  for (int i = 0; i < num_candidates; i++) {
    int index = chkpts_indices[i];
    const FULLPEL_MV this_mv = { center_mv.row + site[index].mv.row,
                                 center_mv.col + site[index].mv.col };
    if (!av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
      if (cost_list) {
        cost_list[index + 1] = INT_MAX;
      }
      continue;
    }
    const int thissad = get_mvpred_sad(
        ms_params, src, center_address + site[index].offset, ref->stride);
    if (cost_list) {
      cost_list[index + 1] = thissad;
    }
    const int found_better_mv = update_mvs_and_sad(
        thissad, &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = i;
  }
}